

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

void __thiscall
SemanticAnalyzerRun::pushScope
          (SemanticAnalyzerRun *this,bool newFn,
          vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *itemsToDeclare)

{
  bool *errorMessage;
  shared_ptr<Scope> *__args_1;
  pointer psVar1;
  Scope *this_00;
  element_type *peVar2;
  shared_ptr<Token> *item;
  pointer token;
  shared_ptr<Scope> newScope;
  optional<VariableDefinition> find;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  shared_ptr<Token> local_48;
  bool local_31 [8];
  bool newFn_local;
  
  local_31[0] = newFn;
  peVar2 = (element_type *)operator_new(0x60);
  __args_1 = &this->currentScope;
  (peVar2->outerScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  (peVar2->outerScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_00130348;
  __gnu_cxx::new_allocator<Scope>::construct<Scope,bool&,std::shared_ptr<Scope>&>
            ((new_allocator<Scope> *)
             &newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Scope *)&peVar2->localScope,local_31,__args_1);
  (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&peVar2->localScope;
  newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newScope);
  token = (itemsToDeclare->
          super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>).
          _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (itemsToDeclare->
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (token != psVar1) {
    errorMessage = &find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                    super__Optional_payload<VariableDefinition,_true,_false,_false>.
                    super__Optional_payload_base<VariableDefinition>._M_engaged;
    do {
      Scope::findLocally((optional<VariableDefinition> *)
                         &newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ,(__args_1->super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                         &((token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          value,false);
      if (find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
          super__Optional_payload<VariableDefinition,_true,_false,_false>.
          super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true)
      {
        find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._24_8_ = &local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)errorMessage,"Duplicate identifier found within the same scope.","");
        reportError(this,token,(string *)errorMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
               super__Optional_payload<VariableDefinition,_true,_false,_false>.
               super__Optional_payload_base<VariableDefinition>._24_8_ != &local_58) {
          operator_delete((void *)find.super__Optional_base<VariableDefinition,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<VariableDefinition,_true,_false,_false>.
                                  super__Optional_payload_base<VariableDefinition>._24_8_,
                          local_58._M_allocated_capacity + 1);
        }
      }
      else {
        this_00 = (__args_1->super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Scope::define(this_00,&(local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->value,&local_48,true);
        if (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if (find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
          super__Optional_payload<VariableDefinition,_true,_false,_false>.
          super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true)
      {
        find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound = false;
        if (find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
            super__Optional_payload<VariableDefinition,_true,_false,_false>.
            super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
            super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                     super__Optional_payload<VariableDefinition,_true,_false,_false>.
                     super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
                     super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      token = token + 1;
    } while (token != psVar1);
  }
  if (newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               newScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void pushScope(bool newFn, const std::vector<std::shared_ptr<Token>>& itemsToDeclare) noexcept {
    auto newScope = std::make_shared<Scope>(newFn, this->currentScope);
    this->currentScope = newScope;

    for (auto& item : itemsToDeclare) {
      auto find = this->currentScope->findLocally(item->value, false);

      if (find) {
        this->reportError(item, "Duplicate identifier found within the same scope.");

      } else {
        this->currentScope->define(item->value, item, true);
      }
    }
  }